

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Array.h
# Opt level: O1

void __thiscall SmallArray<InplaceStr,_8U>::grow(SmallArray<InplaceStr,_8U> *this,uint newSize)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  InplaceStr *pIVar3;
  uint uVar4;
  undefined8 uVar5;
  int iVar6;
  undefined4 extraout_var;
  InplaceStr *__s;
  long lVar7;
  uint uVar8;
  ulong uVar9;
  
  uVar8 = (this->max >> 1) + this->max;
  uVar4 = newSize + 4;
  if (newSize < uVar8) {
    uVar4 = uVar8;
  }
  if (this->allocator == (Allocator *)0x0) {
    __s = (InplaceStr *)(*(code *)NULLC::alloc)(uVar4 << 4 | 4);
  }
  else {
    iVar6 = (*this->allocator->_vptr_Allocator[2])();
    __s = (InplaceStr *)CONCAT44(extraout_var,iVar6);
  }
  if (uVar4 != 0) {
    memset(__s,0,(long)(int)uVar4 << 4);
  }
  if (this->count != 0) {
    lVar7 = 0;
    uVar9 = 0;
    do {
      puVar1 = (undefined8 *)((long)&this->data->begin + lVar7);
      uVar5 = puVar1[1];
      puVar2 = (undefined8 *)((long)&__s->begin + lVar7);
      *puVar2 = *puVar1;
      puVar2[1] = uVar5;
      uVar9 = uVar9 + 1;
      lVar7 = lVar7 + 0x10;
    } while (uVar9 < this->count);
  }
  pIVar3 = this->data;
  if (pIVar3 != this->little) {
    if (this->allocator == (Allocator *)0x0) {
      if (pIVar3 != (InplaceStr *)0x0) {
        (*(code *)NULLC::dealloc)(pIVar3);
      }
    }
    else if (pIVar3 != (InplaceStr *)0x0) {
      (*this->allocator->_vptr_Allocator[3])();
    }
  }
  this->data = __s;
  this->max = uVar4;
  return;
}

Assistant:

void grow(unsigned newSize)
	{
		if(max + (max >> 1) > newSize)
			newSize = max + (max >> 1);
		else
			newSize += 4;

		T* newData = 0;
		
		if(allocator)
			newData = allocator->construct<T>(newSize);
		else
			newData = NULLC::construct<T>(newSize);

		for(unsigned i = 0; i < count; i++)
			newData[i] = data[i];

		if(data != little)
		{
			if(allocator)
				allocator->destruct(data, max);
			else
				NULLC::destruct(data, max);
		}

		data = newData;

		max = newSize;
	}